

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

arena_t * duckdb_je_arena_init(tsdn_t *tsdn,uint ind,arena_config_t *config)

{
  int iVar1;
  arena_t *paVar2;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
  if (iVar1 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_arenas_lock);
    duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  duckdb_je_arenas_lock.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_arenas_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (duckdb_je_arenas_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
    duckdb_je_arenas_lock.field_0.witness.link.qre_prev =
         (witness_t *)(duckdb_je_arenas_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_arenas_lock.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  paVar2 = arena_init_locked(tsdn,ind,config);
  duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
  arena_new_create_background_thread(tsdn,ind);
  return paVar2;
}

Assistant:

arena_t *
arena_init(tsdn_t *tsdn, unsigned ind, const arena_config_t *config) {
	arena_t *arena;

	malloc_mutex_lock(tsdn, &arenas_lock);
	arena = arena_init_locked(tsdn, ind, config);
	malloc_mutex_unlock(tsdn, &arenas_lock);

	arena_new_create_background_thread(tsdn, ind);

	return arena;
}